

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O2

void __thiscall HDD::Reset(HDD *this)

{
  this->h = -1;
  memset(&this->sIdentify,0,0x204);
  this->cyls = 0;
  this->heads = 0;
  this->sectors = 0;
  this->sector_size = 0;
  *(undefined8 *)&this->data_offset = 0;
  *(undefined8 *)((long)&this->total_sectors + 4) = 0;
  *(undefined4 *)((long)&this->total_bytes + 4) = 0;
  std::__cxx11::string::assign((char *)&this->strFirmwareRevision);
  std::__cxx11::string::_M_assign((string *)&this->strSerialNumber);
  std::__cxx11::string::_M_assign((string *)&this->strMakeModel);
  return;
}

Assistant:

void HDD::Reset()
{
    h = -1;

    cyls = heads = sectors = 0;
    total_sectors = total_bytes = 0;
    sector_size = data_offset = 0;

    memset(&sIdentify, 0, sizeof(sIdentify));

    strMakeModel = strSerialNumber = strFirmwareRevision = "";
}